

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O2

void __thiscall
HighsCliqueTable::extractCliquesFromCut
          (HighsCliqueTable *this,HighsMipSolver *mipsolver,HighsInt *inds,double *vals,HighsInt len
          ,double rhs)

{
  HighsDomain *this_00;
  HighsMipSolverData *pHVar1;
  double *pdVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end;
  bool bVar3;
  int iVar4;
  HighsInt HVar5;
  pointer piVar6;
  int iVar7;
  ulong uVar8;
  HighsInt i;
  ulong uVar9;
  size_type sVar10;
  pointer piVar11;
  uint uVar12;
  size_type __new_size;
  int iVar13;
  ulong uVar14;
  long lVar15;
  bool bVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  HighsCDouble HVar22;
  HighsDomainChange boundchg;
  double *vals_local;
  HighsInt *inds_local;
  double local_118;
  ulong uStack_110;
  vector<int,_std::allocator<int>_> perm;
  HighsCDouble local_d8;
  double local_c8;
  HighsCliqueTable *local_c0;
  double local_b8;
  double local_b0;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> clique;
  HighsCDouble local_78;
  long local_60;
  HighsImplications *local_58;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_50;
  size_type local_48;
  HighsCDouble local_40;
  
  if (this->maxEntries <= this->numEntries) {
    return;
  }
  pHVar1 = (mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  local_58 = &pHVar1->implications;
  this_00 = &pHVar1->domain;
  local_b0 = pHVar1->feastol;
  local_c8 = (double)CONCAT44(local_c8._4_4_,len);
  local_78.hi = 0.0;
  local_78.lo = 0.0;
  uVar12 = 0;
  vals_local = vals;
  inds_local = inds;
  local_c0 = this;
  local_b8 = rhs;
  for (uVar9 = 0; dVar19 = local_78.lo, (uint)len != uVar9; uVar9 = uVar9 + 1) {
    local_118 = local_78.hi;
    bVar3 = HighsDomain::isBinary(this_00,inds[uVar9]);
    if (vals[uVar9] <= 0.0) {
      dVar20 = *(double *)
                (*(long *)&(pHVar1->domain).col_upper_.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl +
                (long)inds[uVar9] * 8);
      bVar16 = dVar20 < INFINITY;
    }
    else {
      dVar20 = *(double *)
                (*(long *)&(pHVar1->domain).col_lower_.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl +
                (long)inds[uVar9] * 8);
      bVar16 = -INFINITY < dVar20;
    }
    if (!bVar16) {
      return;
    }
    dVar20 = vals[uVar9] * dVar20;
    local_78.hi = dVar20 + local_118;
    uVar12 = uVar12 + bVar3;
    local_78.lo = dVar19 + (local_118 - (local_78.hi - dVar20)) +
                           (dVar20 - (local_78.hi - (local_78.hi - dVar20)));
  }
  for (uVar9 = 0; (uint)len != uVar9; uVar9 = uVar9 + 1) {
    if ((mipsolver->model_->integrality_).
        super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
        super__Vector_impl_data._M_start[inds_local[uVar9]] != kContinuous) {
      HVar22 = operator-(local_b8,&local_78);
      perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)HVar22.lo;
      perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)HVar22.hi;
      HVar22 = HighsCDouble::operator/((HighsCDouble *)&perm,vals_local[uVar9]);
      local_118 = HVar22.lo + HVar22.hi;
      if (vals_local[uVar9] <= 0.0) {
        local_118 = local_118 +
                    *(double *)
                     (*(long *)&(pHVar1->domain).col_upper_.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl +
                     (long)inds_local[uVar9] * 8);
        dVar19 = HighsDomain::feastol(this_00);
        dVar19 = ceil(local_118 - dVar19);
        uVar17 = SUB84(dVar19,0);
        uVar18 = (undefined4)((ulong)dVar19 >> 0x20);
        uVar14 = (ulong)(uint)inds_local[uVar9];
      }
      else {
        local_118 = local_118 +
                    *(double *)
                     (*(long *)&(pHVar1->domain).col_lower_.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl +
                     (long)inds_local[uVar9] * 8);
        dVar19 = HighsDomain::feastol(this_00);
        dVar19 = floor(dVar19 + local_118);
        uVar17 = SUB84(dVar19,0);
        uVar18 = (undefined4)((ulong)dVar19 >> 0x20);
        uVar14 = (ulong)(uint)inds_local[uVar9] + 0x100000000;
      }
      boundchg.boundval._4_4_ = uVar18;
      boundchg.boundval._0_4_ = uVar17;
      boundchg.column = (int)uVar14;
      boundchg.boundtype = (int)(uVar14 >> 0x20);
      HighsDomain::changeBound(this_00,boundchg,(Reason)0xfffffffe);
      if ((pHVar1->domain).infeasible_ != false) {
        return;
      }
    }
  }
  if (uVar12 < 2) {
    return;
  }
  perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __new_size = (size_type)local_c8._0_4_;
  std::vector<int,_std::allocator<int>_>::resize(&perm,__new_size);
  iVar4 = 0;
  for (piVar6 = perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      piVar6 != perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish; piVar6 = piVar6 + 1) {
    *piVar6 = iVar4;
    iVar4 = iVar4 + 1;
  }
  clique.
  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)&inds_local;
  piVar6 = perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  piVar11 = perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish;
  clique.
  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
  do {
    local_60 = -(long)piVar6;
    lVar15 = (long)piVar6 * -0x40000000;
    while( true ) {
      if (piVar6 == piVar11) goto LAB_00277c97;
      bVar3 = extractCliquesFromCut::anon_class_16_2_0183c0cc::operator()
                        ((anon_class_16_2_0183c0cc *)&clique,*piVar6);
      if (!bVar3) break;
      piVar6 = piVar6 + 1;
      local_60 = local_60 + -4;
      lVar15 = lVar15 + -0x100000000;
    }
    do {
      piVar11 = piVar11 + -1;
      if (piVar11 == piVar6) goto LAB_00277c97;
      bVar3 = extractCliquesFromCut::anon_class_16_2_0183c0cc::operator()
                        ((anon_class_16_2_0183c0cc *)&clique,*piVar11);
    } while (!bVar3);
    HVar5 = *piVar6;
    *piVar6 = *piVar11;
    *piVar11 = HVar5;
    piVar6 = piVar6 + 1;
  } while( true );
LAB_00277c97:
  uVar9 = -(local_60 +
           (long)perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start) >> 2;
  uVar12 = (uint)uVar9;
  local_50._M_current = piVar6;
  if ((int)uVar12 < local_c8._0_4_) {
    local_48 = -((long)perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start * 0x40000000 + lVar15) >> 0x20;
    local_c8 = (double)(uVar9 & 0xffffffff);
    dVar19 = 0.0;
    while (dVar19 != local_c8) {
      HVar5 = inds_local
              [perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[(long)dVar19]];
      HVar22 = operator-(local_b8,&local_78);
      local_d8.lo = HVar22.lo;
      local_d8.hi = HVar22.hi;
      local_118 = dVar19;
      HVar22 = HighsCDouble::operator-
                         (&local_d8,
                          ABS(vals_local
                              [perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[(long)dVar19]]));
      clique.
      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)HVar22.lo;
      clique.
      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)HVar22.hi;
      for (sVar10 = local_48; __new_size != sVar10; sVar10 = sVar10 + 1) {
        iVar4 = inds_local
                [perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[sVar10]];
        lVar15 = (long)iVar4;
        dVar19 = *(double *)
                  (*(long *)&(pHVar1->domain).col_lower_.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl +
                  lVar15 * 8);
        dVar20 = *(double *)
                  (*(long *)&(pHVar1->domain).col_upper_.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl +
                  lVar15 * 8);
        if ((dVar19 != dVar20) || (NAN(dVar19) || NAN(dVar20))) {
          dVar21 = vals_local
                   [perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[sVar10]];
          if (dVar21 <= 0.0) {
            HVar22 = HighsCDouble::operator+((HighsCDouble *)&clique,dVar21 * dVar20);
            piVar6 = perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar2 = vals_local;
            dVar19 = (HVar22.lo + HVar22.hi) /
                     vals_local
                     [perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[sVar10]];
            if ((mipsolver->model_->integrality_).
                super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                super__Vector_impl_data._M_start[lVar15] != kContinuous) {
              dVar19 = ceil(dVar19 - ((mipsolver->mipdata_)._M_t.
                                      super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                      .super__Head_base<0UL,_HighsMipSolverData_*,_false>.
                                     _M_head_impl)->feastol);
            }
            dVar20 = *(double *)
                      (*(long *)&(pHVar1->domain).col_lower_.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl +
                      lVar15 * 8);
            if (local_b0 + dVar20 < dVar19) {
              if (0.0 < pdVar2[piVar6[(long)local_118]] || pdVar2[piVar6[(long)local_118]] == 0.0) {
                if (dVar20 <= -INFINITY) goto LAB_00277dab;
                dVar21 = dVar19 - dVar20;
              }
              else {
                dVar21 = dVar20 - dVar19;
                dVar20 = dVar19;
              }
              HighsImplications::addVLB(local_58,iVar4,HVar5,dVar21,dVar20);
            }
          }
          else {
            HVar22 = HighsCDouble::operator+((HighsCDouble *)&clique,dVar21 * dVar19);
            piVar6 = perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar2 = vals_local;
            dVar19 = (HVar22.lo + HVar22.hi) /
                     vals_local
                     [perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[sVar10]];
            if ((mipsolver->model_->integrality_).
                super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                super__Vector_impl_data._M_start[lVar15] != kContinuous) {
              dVar19 = floor(dVar19 + ((mipsolver->mipdata_)._M_t.
                                       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                       .super__Head_base<0UL,_HighsMipSolverData_*,_false>.
                                      _M_head_impl)->feastol);
            }
            dVar20 = *(double *)
                      (*(long *)&(pHVar1->domain).col_upper_.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl +
                      lVar15 * 8);
            if (dVar19 < dVar20 - local_b0) {
              if (0.0 < pdVar2[piVar6[(long)local_118]] || pdVar2[piVar6[(long)local_118]] == 0.0) {
                if (INFINITY <= dVar20) goto LAB_00277dab;
                dVar21 = dVar19 - dVar20;
              }
              else {
                dVar21 = dVar20 - dVar19;
                dVar20 = dVar19;
              }
              HighsImplications::addVUB(local_58,iVar4,HVar5,dVar21,dVar20);
            }
          }
        }
LAB_00277dab:
      }
      dVar19 = (double)((long)local_118 + 1);
    }
  }
  if (1 < (int)uVar12) {
    clique.
    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    clique.
    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    clique.
    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::reserve
              (&clique,(ulong)(uVar12 & 0x7fffffff));
    end._M_current = local_50._M_current;
    piVar6 = perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if (local_50._M_current !=
        perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start)
    {
      iVar4 = pdqsort_detail::log2<long>
                        (-(local_60 +
                          (long)perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2);
      pdqsort_detail::
      pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCliqueTable::extractCliquesFromCut(HighsMipSolver_const&,int_const*,double_const*,int,double)::__1,false>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)piVar6,end,
                 (anon_class_8_1_8992ca70)&vals_local,iVar4,true);
    }
    local_118 = vals_local
                [*perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                  ._M_start];
    uStack_110 = 0;
    dVar19 = vals_local
             [perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[1]];
    HVar22 = operator-(local_b8,&local_78);
    local_d8.lo = HVar22.lo;
    uStack_110 = uStack_110 & 0x7fffffffffffffff;
    local_118 = ABS(local_118) + ABS(dVar19);
    local_d8.hi = HVar22.hi;
    HVar22 = HighsCDouble::operator+(&local_d8,local_b0);
    if (HVar22.lo + HVar22.hi < local_118) {
      iVar4 = ((mipsolver->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
              numCliqueEntriesAfterPresolve;
      HVar5 = HighsDomain::numModelNonzeros(this_00);
      iVar7 = iVar4 + HVar5 * 4 + 100000;
      iVar4 = local_c0->numEntries;
      iVar13 = uVar12 * 10 + iVar4;
      if (iVar7 <= iVar13) {
        iVar13 = iVar7;
      }
      local_118 = (double)CONCAT44(local_118._4_4_,iVar13);
      while ((uVar12 = (int)uVar9 - 1, uVar9 = (ulong)uVar12, uVar12 != 0 &&
             (iVar4 < local_118._0_4_))) {
        HVar22 = operator-(local_b8,&local_78);
        local_40.lo = HVar22.lo;
        local_40.hi = HVar22.hi;
        HVar22 = HighsCDouble::operator-
                           (&local_40,
                            ABS(vals_local
                                [perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar9]]));
        local_d8.lo = HVar22.lo;
        local_d8.hi = HVar22.hi;
        HVar22 = HighsCDouble::operator+(&local_d8,local_b0);
        uVar14 = uVar9;
        piVar6 = perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        while (uVar8 = uVar14, 0 < (long)uVar8) {
          uVar14 = uVar8 >> 1;
          if (HVar22.lo + HVar22.hi < ABS(vals_local[piVar6[uVar14]])) {
            piVar6 = piVar6 + uVar14 + 1;
            uVar14 = ~uVar14 + uVar8;
          }
        }
        if (piVar6 != perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start) {
          piVar11 = perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (clique.
              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              clique.
              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            clique.
            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 clique.
                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          }
          for (; piVar11 != piVar6; piVar11 = piVar11 + 1) {
            if (0.0 < vals_local[*piVar11] || vals_local[*piVar11] == 0.0) {
              local_d8.hi = (double)CONCAT44(local_d8.hi._4_4_,1);
              std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
              emplace_back<int_const&,int>
                        ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                          *)&clique,inds_local + *piVar11,(int *)&local_d8);
            }
            else {
              local_d8.hi = (double)((ulong)local_d8.hi._4_4_ << 0x20);
              std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
              emplace_back<int_const&,int>
                        ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                          *)&clique,inds_local + *piVar11,(int *)&local_d8);
            }
          }
          if (0.0 < vals_local
                    [perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar9]] ||
              vals_local
              [perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar9]] == 0.0) {
            local_d8.hi = (double)CONCAT44(local_d8.hi._4_4_,1);
            std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
            emplace_back<int_const&,int>
                      ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                        *)&clique,
                       inds_local +
                       perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar9],(int *)&local_d8);
          }
          else {
            local_d8.hi = (double)((ulong)local_d8.hi._4_4_ << 0x20);
            std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
            emplace_back<int_const&,int>
                      ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                        *)&clique,
                       inds_local +
                       perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar9],(int *)&local_d8);
          }
          uVar14 = (long)clique.
                         super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)clique.
                         super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 2;
          if (((1 < uVar14) &&
              ((addClique(local_c0,mipsolver,
                          clique.
                          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                          ._M_impl.super__Vector_impl_data._M_start,(HighsInt)uVar14,false,
                          0x7fffffff), (pHVar1->domain).infeasible_ != false ||
               (local_118._0_4_ <= local_c0->numEntries)))) ||
             (piVar6 == perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + uVar9)) break;
        }
        iVar4 = local_c0->numEntries;
      }
    }
    std::_Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
    ~_Vector_base(&clique.
                   super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                 );
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&perm.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void HighsCliqueTable::extractCliquesFromCut(const HighsMipSolver& mipsolver,
                                             const HighsInt* inds,
                                             const double* vals, HighsInt len,
                                             double rhs) {
  if (isFull()) return;

  HighsImplications& implics = mipsolver.mipdata_->implications;
  HighsDomain& globaldom = mipsolver.mipdata_->domain;

  const double feastol = mipsolver.mipdata_->feastol;

  HighsCDouble minact = 0.0;
  HighsInt nbin = 0;
  for (HighsInt i = 0; i != len; ++i) {
    if (globaldom.isBinary(inds[i])) ++nbin;

    if (vals[i] > 0) {
      if (globaldom.col_lower_[inds[i]] == -kHighsInf) return;
      minact += vals[i] * globaldom.col_lower_[inds[i]];
    } else {
      if (globaldom.col_upper_[inds[i]] == kHighsInf) return;
      minact += vals[i] * globaldom.col_upper_[inds[i]];
    }
  }

  for (HighsInt i = 0; i != len; ++i) {
    if (mipsolver.variableType(inds[i]) == HighsVarType::kContinuous) continue;

    double boundVal = double((rhs - minact) / vals[i]);
    if (vals[i] > 0) {
      boundVal = std::floor(boundVal + globaldom.col_lower_[inds[i]] +
                            globaldom.feastol());
      globaldom.changeBound(HighsBoundType::kUpper, inds[i], boundVal,
                            HighsDomain::Reason::unspecified());
      if (globaldom.infeasible()) return;
    } else {
      boundVal = std::ceil(boundVal + globaldom.col_upper_[inds[i]] -
                           globaldom.feastol());
      globaldom.changeBound(HighsBoundType::kLower, inds[i], boundVal,
                            HighsDomain::Reason::unspecified());
      if (globaldom.infeasible()) return;
    }
  }

  if (nbin <= 1) return;

  std::vector<HighsInt> perm;
  perm.resize(len);
  std::iota(perm.begin(), perm.end(), 0);

  auto binaryend = std::partition(perm.begin(), perm.end(), [&](HighsInt pos) {
    return globaldom.isBinary(inds[pos]);
  });

  nbin = binaryend - perm.begin();

  // if not all variables are binary, we extract variable upper and lower bounds
  // constraints on the non-binary variable for each binary variable in the
  // constraint:
  if (nbin < len) {
    for (HighsInt i = 0; i != nbin; ++i) {
      HighsInt bincol = inds[perm[i]];
      HighsCDouble impliedActivity = rhs - minact - std::abs(vals[perm[i]]);
      for (HighsInt j = nbin; j != len; ++j) {
        HighsInt col = inds[perm[j]];
        if (globaldom.isFixed(col)) continue;

        if (vals[perm[j]] > 0) {
          double implcolub = double(impliedActivity +
                                    vals[perm[j]] * globaldom.col_lower_[col]) /
                             vals[perm[j]];
          if (mipsolver.variableType(col) != HighsVarType::kContinuous)
            implcolub = std::floor(implcolub + mipsolver.mipdata_->feastol);

          if (implcolub < globaldom.col_upper_[col] - feastol) {
            double coef;
            double constant;
            if (vals[perm[i]] < 0) {
              coef = globaldom.col_upper_[col] - implcolub;
              constant = implcolub;
            } else {
              // make sure that upper bound is not infinite to avoid adding VUB
              // with coefficient '-kHighsInf' and constant 'kHighsInf'
              if (globaldom.col_upper_[col] == kHighsInf) continue;
              coef = implcolub - globaldom.col_upper_[col];
              constant = globaldom.col_upper_[col];
            }
            // printf("extracted VUB from cut: x%" HIGHSINT_FORMAT " <= %g*y%"
            // HIGHSINT_FORMAT " + %g\n", col, coef,
            //        bincol, constant);
            implics.addVUB(col, bincol, coef, constant);
          }
        } else {
          double implcollb = double(impliedActivity +
                                    vals[perm[j]] * globaldom.col_upper_[col]) /
                             vals[perm[j]];
          if (mipsolver.variableType(col) != HighsVarType::kContinuous)
            implcollb = std::ceil(implcollb - mipsolver.mipdata_->feastol);

          if (implcollb > globaldom.col_lower_[col] + feastol) {
            double coef;
            double constant;
            if (vals[perm[i]] < 0) {
              coef = globaldom.col_lower_[col] - implcollb;
              constant = implcollb;
            } else {
              // make sure that lower bound is not infinite to avoid adding VLB
              // with coefficient 'kHighsInf' and constant '-kHighsInf'
              if (globaldom.col_lower_[col] == -kHighsInf) continue;
              coef = implcollb - globaldom.col_lower_[col];
              constant = globaldom.col_lower_[col];
            }

            // printf("extracted VLB from cut: x%" HIGHSINT_FORMAT " >= %g*y%"
            // HIGHSINT_FORMAT " + %g\n", col, coef,
            //        bincol, constant);
            implics.addVLB(col, bincol, coef, constant);
            // printf("extracted VLB from cut\n");
          }
        }
      }
    }
  }

  // only one binary means we do have no cliques
  if (nbin <= 1) return;

  std::vector<CliqueVar> clique;
  clique.reserve(nbin);

  pdqsort(perm.begin(), binaryend, [&](HighsInt p1, HighsInt p2) {
    return std::make_pair(std::abs(vals[p1]), p1) >
           std::make_pair(std::abs(vals[p2]), p2);
  });
  // check if any cliques exists
  if (std::abs(vals[perm[0]]) + std::abs(vals[perm[1]]) <=
      double(rhs - minact + feastol))
    return;

  HighsInt maxNewEntries =
      std::min(mipsolver.mipdata_->numCliqueEntriesAfterPresolve + 100000 +
                   4 * globaldom.numModelNonzeros(),
               numEntries + 10 * nbin);

  for (HighsInt k = nbin - 1; k != 0 && numEntries < maxNewEntries; --k) {
    double mincliqueval =
        double(rhs - minact - std::abs(vals[perm[k]]) + feastol);
    auto cliqueend = std::partition_point(
        perm.begin(), perm.begin() + k,
        [&](HighsInt p) { return std::abs(vals[p]) > mincliqueval; });

    // no clique for this variable
    if (cliqueend == perm.begin()) continue;

    clique.clear();

    for (auto j = perm.begin(); j != cliqueend; ++j) {
      HighsInt pos = *j;
      if (vals[pos] < 0)
        clique.emplace_back(inds[pos], 0);
      else
        clique.emplace_back(inds[pos], 1);
    }

    if (vals[perm[k]] < 0)
      clique.emplace_back(inds[perm[k]], 0);
    else
      clique.emplace_back(inds[perm[k]], 1);

    // printf("extracted this clique:\n");
    // printClique(clique);
    if (clique.size() >= 2) {
      // printf("extracted clique from cut\n");
      // if (clique.size() > 2) runCliqueSubsumption(globaldom, clique);

      addClique(mipsolver, clique.data(), clique.size());
      if (globaldom.infeasible() || numEntries >= maxNewEntries) return;
    }

    // further cliques are just subsets of this clique
    if (cliqueend == perm.begin() + k) return;
  }
}